

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::scoutcrossedge
          (tetgenmesh *this,triface *crosstet,arraypool *missingshbds,arraypool *missingshs)

{
  tetrahedron *pppdVar1;
  int iVar2;
  shellface *pppdVar3;
  shellface ppdVar4;
  shellface pb;
  shellface pc;
  tetrahedron Q;
  char *pcVar5;
  long lVar6;
  double *B;
  double *C;
  memorypool *pmVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  uint uVar11;
  interresult iVar12;
  long *plVar13;
  ulong uVar14;
  long lVar15;
  undefined8 *puVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  triface *iedge;
  ulong uVar24;
  long lVar25;
  tetrahedron *pppdVar26;
  long lVar27;
  double dVar28;
  face local_b8;
  ulong local_a8;
  tetrahedron *local_a0;
  tetrahedron local_98;
  triface *local_90;
  double *local_88;
  tetrahedron *local_80;
  arraypool *local_78;
  int types [2];
  triface local_68;
  int poss [4];
  
  local_b8.sh = (shellface *)0x0;
  local_b8.shver = 0;
  local_90 = crosstet;
  local_78 = missingshs;
  if (missingshbds->objects < 1) {
    bVar8 = true;
  }
  else {
    uVar20 = 0;
    bVar9 = false;
    do {
      local_98 = (tetrahedron)
                 missingshbds->toparray
                 [(uint)uVar20 >> ((byte)missingshbds->log2objectsperblock & 0x1f)];
      local_a0 = (tetrahedron *)
                 ((long)missingshbds->objectbytes *
                 (long)(int)(missingshbds->objectsperblockmark & (uint)uVar20));
      uVar22 = *(ulong *)((*(ulong *)(*(long *)((long)local_98 + (long)local_a0) + 0x30 +
                                     (long)(*(int *)((long)local_98 + (long)local_a0 + 8) >> 1) * 8)
                          & 0xfffffffffffffff8) + 0x48);
      uVar11 = (uint)uVar22 & 0xf;
      uVar14 = (ulong)uVar11;
      uVar22 = uVar22 & 0xfffffffffffffff0;
      uVar24 = uVar22;
      local_a8 = uVar20;
      if (*(long *)(uVar22 + (long)orgpivot[uVar11] * 8) !=
          *(long *)(*(long *)((long)local_98 + (long)local_a0) +
                   (long)sorgpivot[*(int *)((long)local_98 + (long)local_a0 + 8)] * 8)) {
        uVar14 = (ulong)(uint)esymtbl[uVar14];
      }
      do {
        local_80 = (tetrahedron *)(long)(int)uVar14;
        bVar8 = bVar9;
        if ((*(byte *)(*(long *)(uVar24 + (long)apexpivot[(long)local_80] * 8) + 4 +
                      (long)this->pointmarkindex * 4) & 2) != 0) {
          pppdVar3 = *(shellface **)((long)local_98 + (long)local_a0);
          iVar23 = 0;
          do {
            uVar11 = enexttbl[(int)uVar14];
            uVar14 = (ulong)uVar11;
            iVar19 = 0;
            if ((*(long *)(uVar24 + 0x40) == 0) ||
               (iVar19 = iVar23,
               *(long *)(*(long *)(uVar24 + 0x40) + (long)ver2edge[(int)uVar11] * 8) == 0)) {
              local_b8.shver = snextpivot[*(int *)((long)local_98 + (long)local_a0 + 8)];
              if (iVar19 != 0) {
                local_b8.shver = snextpivot[local_b8.shver] ^ 1;
                uVar11 = esymtbl[(int)uVar11];
              }
              uVar20 = (ulong)local_b8.shver;
              ppdVar4 = pppdVar3[sorgpivot[uVar20]];
              pb = pppdVar3[sdestpivot[uVar20]];
              pc = pppdVar3[sapexpivot[uVar20]];
              local_88 = (double *)(long)(int)uVar11;
              local_b8.sh = pppdVar3;
              calculateabovepoint4
                        (this,(point)ppdVar4,(point)pb,(point)pc,
                         *(point *)(uVar24 + (long)destpivot[(long)local_88] * 8));
              dVar28 = orient3d((double *)ppdVar4,(double *)pb,(double *)pc,this->dummypoint);
              if (dVar28 <= 0.0) {
                if ((dVar28 == 0.0) && (!NAN(dVar28))) {
                  puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
                  puts("  the message above, your input data set, and the exact");
                  puts("  command line you used to run this program, thank you.");
                  exit(2);
                }
              }
              else {
                local_b8.shver = snextpivot[uVar20 ^ 1];
              }
              iVar12 = sscoutsegment(this,&local_b8,
                                     *(point *)(uVar24 + (long)destpivot[(long)local_88] * 8),0,0,1)
              ;
              if (iVar12 == SHAREEDGE) {
                poss[0] = 0;
                poss[1] = 0;
                poss[2] = 0;
                makeshellface(this,this->subsegs,(face *)poss);
                iVar23 = poss[2];
                uVar10 = poss._0_8_;
                local_b8.sh[(long)(local_b8.shver >> 1) + 6] =
                     (shellface)((long)poss[2] | poss._0_8_);
                *(ulong *)poss._0_8_ = (long)local_b8.shver | (ulong)local_b8.sh;
                ppdVar4 = local_b8.sh[local_b8.shver >> 1];
                local_b8.shver = (uint)ppdVar4 & 7;
                local_b8.sh = (shellface *)((ulong)ppdVar4 & 0xfffffffffffffff8);
                *(shellface *)((long)local_b8.sh + (ulong)((uint)ppdVar4 & 6) * 4 + 0x30) =
                     (shellface)((long)poss[2] | poss._0_8_);
                *(shellface *)poss._0_8_ = ppdVar4;
                lawsonflip(this);
                uVar20 = *(ulong *)(uVar10 + (long)(iVar23 >> 1) * 8);
                uVar14 = uVar20 & 0xfffffffffffffff8;
                uVar20 = (ulong)((uint)uVar20 & 6);
                *(undefined8 *)(uVar14 + 0x30 + uVar20 * 4) = 0;
                uVar20 = *(ulong *)(uVar14 + uVar20 * 4);
                uVar11 = (uint)uVar20;
                local_b8.shver = uVar11 & 7;
                local_b8.sh = (shellface *)(uVar20 & 0xfffffffffffffff8);
                *(undefined8 *)((long)local_b8.sh + (ulong)(uVar11 & 6) * 4 + 0x30) = 0;
                pmVar7 = this->subsegs;
                *(undefined8 *)(uVar10 + 0x18) = 0;
                *(void **)uVar10 = pmVar7->deaditemstack;
                pmVar7->deaditemstack = (void *)uVar10;
                pmVar7->items = pmVar7->items + -1;
                bVar9 = true;
              }
              else if (this->flipstack != (badface *)0x0) {
                lawsonflip(this);
              }
              break;
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 == 1);
          bVar8 = false;
          if (bVar9) {
            bVar9 = true;
            break;
          }
        }
        bVar9 = bVar8;
        uVar20 = *(ulong *)(uVar24 + (long)facepivot1[(long)local_80] * 8);
        uVar24 = uVar20 & 0xfffffffffffffff0;
        uVar14 = (ulong)(uint)facepivot2[(long)local_80][(uint)uVar20 & 0xf];
      } while (uVar24 != uVar22);
      uVar20 = local_a8 + 1;
      bVar8 = !bVar9;
    } while (((long)uVar20 < missingshbds->objects) && (!bVar9));
  }
  if (bVar8) {
    if (0 < missingshbds->objects) {
      lVar21 = 0;
      local_a8 = local_a8 & 0xffffffff00000000;
LAB_0012e098:
      lVar15 = (long)missingshbds->objectbytes *
               (long)(int)(missingshbds->objectsperblockmark & (uint)lVar21);
      uVar20 = *(ulong *)((*(ulong *)(*(long *)(missingshbds->toparray
                                                [(uint)lVar21 >>
                                                 ((byte)missingshbds->log2objectsperblock & 0x1f)] +
                                               lVar15) + 0x30 +
                                     (long)(*(int *)(missingshbds->toparray
                                                     [(uint)lVar21 >>
                                                      ((byte)missingshbds->log2objectsperblock &
                                                      0x1f)] + lVar15 + 8) >> 1) * 8) &
                          0xfffffffffffffff8) + 0x48);
      uVar11 = (uint)uVar20 & 0xf;
      pppdVar26 = (tetrahedron *)(uVar20 & 0xfffffffffffffff0);
      iVar23 = 0;
      local_80 = pppdVar26;
LAB_0012e0eb:
      local_98 = pppdVar26[apexpivot[(int)uVar11]];
      if (((((local_98 != (tetrahedron)this->dummypoint) &&
            (Q = pppdVar26[oppopivot[(int)uVar11]], Q != (tetrahedron)this->dummypoint)) &&
           ((*(byte *)((long)local_98 + (long)this->pointmarkindex * 4 + 4) & 2) == 0)) &&
          (((*(byte *)((long)Q + (long)this->pointmarkindex * 4 + 4) & 2) == 0 && (iVar23 == 0))))
         && (0 < local_78->objects)) {
        lVar15 = 0;
        local_a0 = pppdVar26;
        while( true ) {
          pcVar5 = local_78->toparray[(uint)lVar15 >> ((byte)local_78->log2objectsperblock & 0x1f)];
          lVar25 = (long)local_78->objectbytes *
                   (long)(int)(local_78->objectsperblockmark & (uint)lVar15);
          lVar6 = *(long *)(pcVar5 + lVar25);
          iVar23 = *(int *)(pcVar5 + lVar25 + 8);
          local_88 = *(double **)(lVar6 + (long)sorgpivot[iVar23] * 8);
          B = *(double **)(lVar6 + (long)sdestpivot[iVar23] * 8);
          C = *(double **)(lVar6 + (long)sapexpivot[iVar23] * 8);
          iVar23 = tri_edge_test(this,local_88,B,C,(point)local_98,(point)Q,(point)0x0,1,types,poss)
          ;
          pppdVar26 = local_a0;
          if (iVar23 != 0) break;
          if ((iVar23 != 0) || (lVar15 = lVar15 + 1, local_78->objects <= lVar15))
          goto LAB_0012e35a;
        }
        if (iVar23 == 2) {
          iedge = local_90;
          if ((types[0] & 0xfffffffeU) != 8) goto LAB_0012e589;
          local_90->tet = local_a0;
          iVar23 = edestoppotbl[(int)uVar11];
          local_90->ver = iVar23;
          if ((local_a0[8] != (tetrahedron)0x0) && (local_a0[8][ver2edge[iVar23]] != (double *)0x0))
          goto LAB_0012e589;
          local_68.tet = local_90->tet;
          local_68.ver = local_90->ver;
          local_68._12_4_ = *(undefined4 *)&local_90->field_0xc;
          goto LAB_0012e2b4;
        }
      }
      goto LAB_0012e35a;
    }
  }
  else {
    lVar21 = local_78->objects;
    if (0 < lVar21) {
      iVar23 = local_78->log2objectsperblock;
      uVar11 = local_78->objectsperblockmark;
      iVar19 = local_78->objectbytes;
      lVar15 = 0;
      do {
        plVar13 = (long *)((long)(local_78->toparray[(uint)lVar15 >> ((byte)iVar23 & 0x1f)] +
                                 (long)(int)((uint)lVar15 & uVar11) * (long)iVar19) + 8);
        lVar6 = *(long *)(local_78->toparray[(uint)lVar15 >> ((byte)iVar23 & 0x1f)] +
                         (long)(int)((uint)lVar15 & uVar11) * (long)iVar19);
        iVar2 = this->shmarkindex;
        iVar18 = 0;
        do {
          lVar25 = *plVar13;
          lVar27 = (long)((int)lVar25 >> 1);
          uVar20 = *(ulong *)(lVar6 + 0x30 + lVar27 * 8);
          if ((uVar20 != 0) &&
             (puVar16 = (undefined8 *)(uVar20 & 0xfffffffffffffff8),
             (*(byte *)((long)puVar16 + (long)iVar2 * 4 + 4) & 1) != 0)) {
            uVar17 = (uint)puVar16[9] & 0xf;
            uVar22 = puVar16[9] & 0xfffffffffffffff0;
            uVar20 = uVar22;
            do {
              if (*(long *)(uVar20 + 0x40) != 0) {
                *(undefined8 *)(*(long *)(uVar20 + 0x40) + (long)ver2edge[(int)uVar17] * 8) = 0;
              }
              uVar24 = *(ulong *)(uVar20 + (long)facepivot1[(int)uVar17] * 8);
              uVar20 = uVar24 & 0xfffffffffffffff0;
              uVar17 = facepivot2[(int)uVar17][(uint)uVar24 & 0xf];
            } while (uVar20 != uVar22);
            pmVar7 = this->subsegs;
            puVar16[3] = 0;
            *puVar16 = pmVar7->deaditemstack;
            pmVar7->deaditemstack = puVar16;
            pmVar7->items = pmVar7->items + -1;
            *(undefined8 *)(lVar6 + 0x30 + lVar27 * 8) = 0;
          }
          plVar13 = (long *)(snextpivot + (int)lVar25);
          iVar18 = iVar18 + 1;
        } while (iVar18 != 3);
        lVar15 = lVar15 + 1;
      } while (lVar15 != lVar21);
    }
    this->fillregioncount = this->fillregioncount + 1;
  }
  local_a8 = 0;
LAB_0012e50d:
  return (int)local_a8;
  while( true ) {
    pppdVar1 = local_68.tet + (local_68.ver & 3);
    local_68.tet = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
    local_68.ver = fsymtbl[local_68.ver][(uint)*pppdVar1 & 0xf];
    if (local_a0 == local_68.tet) break;
LAB_0012e2b4:
    if ((local_68.tet[9] != (tetrahedron)0x0) &&
       (local_68.tet[9][local_68.ver & 3] != (double *)0x0)) break;
  }
  if ((local_68.tet[9] != (tetrahedron)0x0) && (local_68.tet[9][local_68.ver & 3] != (double *)0x0))
  {
    iedge = &local_68;
LAB_0012e589:
    report_selfint_face(this,local_88,B,C,(face *)(pcVar5 + lVar25),iedge,2,types,poss);
  }
  dVar28 = orient3d(local_88,B,C,(double *)local_98);
  iVar23 = 2;
  local_a8 = CONCAT44(local_a8._4_4_,1);
  if (dVar28 < 0.0) {
    local_90->ver = esymtbl[local_90->ver];
  }
LAB_0012e35a:
  if (0 < iVar23) goto LAB_0012e397;
  pppdVar1 = pppdVar26 + facepivot1[(int)uVar11];
  pppdVar26 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
  uVar11 = facepivot2[(int)uVar11][(uint)*pppdVar1 & 0xf];
  if (pppdVar26 == local_80) goto LAB_0012e397;
  goto LAB_0012e0eb;
LAB_0012e397:
  lVar21 = lVar21 + 1;
  if ((missingshbds->objects <= lVar21) || ((int)local_a8 != 0)) goto LAB_0012e50d;
  goto LAB_0012e098;
}

Assistant:

int tetgenmesh::scoutcrossedge(triface& crosstet, arraypool* missingshbds, 
                               arraypool* missingshs)
{
  triface searchtet, spintet, neightet;
  face oldsh, searchsh, *parysh;
  face neighseg;
  point pa, pb, pc, pd, pe;
  REAL ori;
  int types[2], poss[4];
  int searchflag, interflag;
  int t1ver;
  int i, j;

  searchflag = 0;

  // Search the first new subface to fill the region.
  for (i = 0; i < missingshbds->objects && !searchflag; i++) {
    parysh = (face *) fastlookup(missingshbds, i);
    sspivot(*parysh, neighseg);
    sstpivot1(neighseg, searchtet);
    if (org(searchtet) != sorg(*parysh)) {
      esymself(searchtet);
    }
    spintet = searchtet;
    while (1) {
      if (pmarktested(apex(spintet))) {
        // A possible interior face.
        neightet = spintet;
        oldsh = *parysh;
		// Try to recover an interior edge.
		for (j = 0; j < 2; j++) {
		  enextself(neightet);
          if (!issubseg(neightet)) {
			if (j == 0) {
              senext(oldsh, searchsh);
            } else {
              senext2(oldsh, searchsh);
              sesymself(searchsh);
		      esymself(neightet);
            }
            // Calculate a lifted point. 
			pa = sorg(searchsh);
            pb = sdest(searchsh);
            pc = sapex(searchsh);
            pd = dest(neightet);
            calculateabovepoint4(pa, pb, pc, pd);
            // The lifted point must lie above 'searchsh'.
			ori = orient3d(pa, pb, pc, dummypoint);
			if (ori > 0) {
		      sesymself(searchsh);
		      senextself(searchsh);
		    } else if (ori == 0) {
		      terminatetetgen(this, 2);
		    }
			if (sscoutsegment(&searchsh,dest(neightet),0,0,1)==SHAREEDGE) {
              // Insert a temp segment to protect the recovered edge.
              face tmpseg;
              makeshellface(subsegs, &tmpseg);
              ssbond(searchsh, tmpseg);
              spivotself(searchsh);
              ssbond(searchsh, tmpseg);
              // Recover locally Delaunay edges.
              lawsonflip();
              // Delete the tmp segment.
              spivot(tmpseg, searchsh);
              ssdissolve(searchsh);
              spivotself(searchsh);
              ssdissolve(searchsh);
              shellfacedealloc(subsegs, tmpseg.sh);
			  searchflag = 1;
            } else {
              // Undo the performed flips.
              if (flipstack != NULL) {
                lawsonflip();
              }
            }
            break;
          } // if (!issubseg(neightet))
		} // j
        if (searchflag) break;
      } // if (pmarktested(apex(spintet)))
      fnextself(spintet);
      if (spintet.tet == searchtet.tet) break;
    }
  } // i

  if (searchflag) {
	// Remove faked segments.
    face checkseg;
    // Remark: We should not use the array 'missingshbds', since the flips may
    //   change the subfaces. We search them from the subfaces in R.
    for (i = 0; i < missingshs->objects; i++) {
      parysh = (face *) fastlookup(missingshs, i);
      oldsh = *parysh;
      for (j = 0; j < 3; j++) {
        if (isshsubseg(oldsh)) {
          sspivot(oldsh, checkseg);
          if (sinfected(checkseg)) {
            // It's a faked segment. Delete it.
            sstpivot1(checkseg, searchtet);
            spintet = searchtet;
            while (1) {
              tssdissolve1(spintet);
              fnextself(spintet);
              if (spintet.tet == searchtet.tet) break;
            }
            shellfacedealloc(subsegs, checkseg.sh);
            ssdissolve(oldsh);
          }
        }
        senextself(oldsh);
      } // j
    }

    fillregioncount++;

    return 0;
  } // if (i < missingshbds->objects)

  searchflag = 0;

  for (j = 0; j < missingshbds->objects && !searchflag; j++) {
    parysh = (face *) fastlookup(missingshbds, j);
    sspivot(*parysh, neighseg);
    sstpivot1(neighseg, searchtet);
    interflag = 0;
    // Let 'spintet' be [#,#,d,e] where [#,#] is the boundary edge of R.
    spintet = searchtet;
    while (1) {
      pd = apex(spintet);
      pe = oppo(spintet);
      // Skip a hull edge.
      if ((pd != dummypoint) && (pe != dummypoint)) {
        // Skip an edge containing a vertex of R.
        if (!pmarktested(pd) && !pmarktested(pe)) {
          // Check if [d,e] intersects R.
          for (i = 0; i < missingshs->objects && !interflag; i++) {
            parysh = (face *) fastlookup(missingshs, i);
            pa = sorg(*parysh);
            pb = sdest(*parysh);
            pc = sapex(*parysh);
            interflag=tri_edge_test(pa, pb, pc, pd, pe, NULL, 1, types, poss);
            if (interflag > 0) { 
              if (interflag == 2) {
                // They intersect at a single point.
				if ((types[0] == (int) ACROSSFACE) ||
				    (types[0] == (int) ACROSSEDGE)) {
                  // Go to the crossing edge [d,e,#,#].
                  edestoppo(spintet, crosstet); // // [d,e,#,#].
                  if (issubseg(crosstet)) {
				    // It is a segment. Report a PLC problem.
				    report_selfint_face(pa, pb, pc, parysh, &crosstet, 
					                    interflag, types, poss);
                  } else {
				    triface chkface = crosstet;
					while (1) {
					  if (issubface(chkface)) break;
					  fsymself(chkface);
					  if (chkface.tet == crosstet.tet) break;
					}
					if (issubface(chkface)) {
					  // Two subfaces are intersecting.
                      report_selfint_face(pa, pb, pc, parysh, &chkface, 
					                    interflag, types, poss);
					}
				  }
                  // Adjust the edge such that d lies below [a,b,c].
                  ori = orient3d(pa, pb, pc, pd);
                  if (ori < 0) {
                    esymself(crosstet);
                  }
                  searchflag = 1;                  
                } else {
                  // An improper intersection type, ACROSSVERT, TOUCHFACE,
				  //   TOUCHEDGE, SHAREVERT, ...
                  // Maybe it is due to a PLC problem.
				  report_selfint_face(pa, pb, pc, parysh, &crosstet, 
					                  interflag, types, poss);
                }
              }
              break;
            } // if (interflag > 0)
          }
        } 
      }
      // Leave search at this bdry edge if an intersection is found.
      if (interflag > 0) break;
      // Go to the next tetrahedron.
      fnextself(spintet);
      if (spintet.tet == searchtet.tet) break; 
    } // while (1)
  } // j

  return searchflag;
}